

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsptree.c
# Opt level: O3

int bsp_find_closest(void *handle,float *point)

{
  int *array;
  int iVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  bsp_tree *tree;
  float fVar5;
  float fVar6;
  float fVar7;
  int *indexarray;
  int *local_28;
  
  iVar1 = _bsp_find_close(*(bsp_node **)((long)handle + 0x10),point,
                          (uint)*(byte *)((long)handle + 8));
  if (iVar1 == -1) {
    iVar1 = -1;
  }
  else {
    fVar5 = 0.0;
    if ((ulong)*(byte *)((long)handle + 8) != 0) {
      uVar3 = 0;
      do {
        fVar6 = point[uVar3] - *(float *)(*(long *)(*handle + uVar3 * 8) + (long)iVar1 * 4);
        fVar5 = fVar5 + fVar6 * fVar6;
        uVar3 = uVar3 + 1;
      } while (*(byte *)((long)handle + 8) != uVar3);
    }
    if (fVar5 < 0.0) {
      fVar5 = sqrtf(fVar5);
    }
    else {
      fVar5 = SQRT(fVar5);
    }
    local_28 = array_create_int(8);
    _bsp_add_points(*(bsp_node **)((long)handle + 0x10),point,(uint)*(byte *)((long)handle + 8),
                    fVar5,&local_28);
    array = local_28;
    uVar2 = array_count(local_28);
    if ((int)uVar2 < 1) {
      iVar1 = -1;
    }
    else {
      fVar5 = 3.4028235e+38;
      iVar1 = -1;
      uVar3 = 0;
      do {
        if ((ulong)*(byte *)((long)handle + 8) == 0) {
          fVar6 = 0.0;
        }
        else {
          fVar6 = 0.0;
          uVar4 = 0;
          do {
            fVar7 = point[uVar4] -
                    *(float *)(*(long *)(*handle + uVar4 * 8) + (long)array[uVar3] * 4);
            fVar6 = fVar6 + fVar7 * fVar7;
            uVar4 = uVar4 + 1;
          } while (*(byte *)((long)handle + 8) != uVar4);
        }
        if (fVar6 < fVar5) {
          iVar1 = array[uVar3];
          fVar5 = fVar6;
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 != uVar2);
    }
    array_destroy(array);
  }
  return iVar1;
}

Assistant:

int
bsp_find_closest(
    void * handle,
    float * point )
{
    int close, closest, i, d, cnt;
    bsp_tree * tree;
    float radius, bestradius;
    int * indexarray;

    tree = (bsp_tree *) handle;
    assert( tree != NULL );

    close = _bsp_find_close( tree->top, point, tree->dimensions );
    if ( close == -1 ) return -1;

    radius = 0.0f;
    for ( d = 0; d < tree->dimensions; d++ ) {
        float diff;
        diff = point[d] - tree->pointarrays[d][close];
        radius += diff * diff;
    }
    radius = (float) sqrt( radius );

    indexarray = array_create_int( 8 );
    bsp_find_points( tree, point, radius, &indexarray );

    cnt = array_count( indexarray );
    closest = -1;
    bestradius = FLT_MAX;
    for ( i = 0; i < cnt; i++ ) {
        radius = 0.0f;
        for ( d = 0; d < tree->dimensions; d++ ) {
            float diff;
            diff = point[d] - tree->pointarrays[d][indexarray[i]];
            radius += diff * diff;
        }
        if ( radius < bestradius ) {
            closest = indexarray[i];
            bestradius = radius;
        }
    }

    array_destroy( indexarray );
    return closest;
}